

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPIRVShaderResources.cpp
# Opt level: O0

string * __thiscall
Diligent::SPIRVShaderResources::DumpResources_abi_cxx11_
          (string *__return_storage_ptr__,SPIRVShaderResources *this)

{
  anon_class_24_3_b67b46a3 HandleUB;
  anon_class_24_3_b67b46a3 HandleSB;
  anon_class_24_3_b67b46a3 HandleImg;
  anon_class_24_3_b67b46a3 HandleSmplImg;
  anon_class_24_3_b67b46a3 HandleAC;
  anon_class_24_3_b67b46a3 HandleSepSmpl;
  anon_class_24_3_b67b46a3 HandleSepImg;
  anon_class_24_3_b67b46a3 HandleInptAtt;
  anon_class_24_3_b67b46a3 HandleAccelStruct;
  Uint32 UVar1;
  Uint32 UVar2;
  ostream *poVar3;
  Char *Message;
  undefined1 local_2b8 [8];
  string msg;
  undefined1 local_1c0 [8];
  anon_class_16_2_2bfcf79f DumpResource;
  Uint32 ResNum;
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [376];
  SPIRVShaderResources *local_18;
  SPIRVShaderResources *this_local;
  
  local_18 = this;
  this_local = (SPIRVShaderResources *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar3 = std::operator<<(local_190,"Shader \'");
  poVar3 = std::operator<<(poVar3,this->m_ShaderName);
  poVar3 = std::operator<<(poVar3,"\' resource stats: total resources: ");
  UVar1 = GetTotalResources(this);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,UVar1);
  poVar3 = std::operator<<(poVar3,":");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(poVar3,"UBs: ");
  UVar1 = GetNumUBs(this);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,UVar1);
  poVar3 = std::operator<<(poVar3,"; SBs: ");
  UVar1 = GetNumSBs(this);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,UVar1);
  poVar3 = std::operator<<(poVar3,"; Imgs: ");
  UVar1 = GetNumImgs(this);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,UVar1);
  poVar3 = std::operator<<(poVar3,"; Smpl Imgs: ");
  UVar1 = GetNumSmpldImgs(this);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,UVar1);
  poVar3 = std::operator<<(poVar3,"; ACs: ");
  UVar1 = GetNumACs(this);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,UVar1);
  poVar3 = std::operator<<(poVar3,"; Sep Imgs: ");
  UVar1 = GetNumSepImgs(this);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,UVar1);
  poVar3 = std::operator<<(poVar3,"; Sep Smpls: ");
  UVar1 = GetNumSepSmplrs(this);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,UVar1);
  poVar3 = std::operator<<(poVar3,'.');
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::operator<<(poVar3,"Resources:");
  DumpResource.ResNum._0_4_ = 0;
  msg.field_2._8_8_ = local_1a0;
  DumpResource.ss = (stringstream *)&DumpResource.ResNum;
  HandleUB.ResNum = (Uint32 *)DumpResource.ss;
  HandleUB.ss = (stringstream *)msg.field_2._8_8_;
  HandleUB.DumpResource = (anon_class_16_2_2bfcf79f *)local_1c0;
  HandleSB.ResNum = (Uint32 *)DumpResource.ss;
  HandleSB.ss = (stringstream *)msg.field_2._8_8_;
  HandleSB.DumpResource = (anon_class_16_2_2bfcf79f *)local_1c0;
  HandleImg.ResNum = (Uint32 *)DumpResource.ss;
  HandleImg.ss = (stringstream *)msg.field_2._8_8_;
  HandleImg.DumpResource = (anon_class_16_2_2bfcf79f *)local_1c0;
  HandleSmplImg.ResNum = (Uint32 *)DumpResource.ss;
  HandleSmplImg.ss = (stringstream *)msg.field_2._8_8_;
  HandleSmplImg.DumpResource = (anon_class_16_2_2bfcf79f *)local_1c0;
  HandleAC.ResNum = (Uint32 *)DumpResource.ss;
  HandleAC.ss = (stringstream *)msg.field_2._8_8_;
  HandleAC.DumpResource = (anon_class_16_2_2bfcf79f *)local_1c0;
  HandleSepSmpl.ResNum = (Uint32 *)DumpResource.ss;
  HandleSepSmpl.ss = (stringstream *)msg.field_2._8_8_;
  HandleSepSmpl.DumpResource = (anon_class_16_2_2bfcf79f *)local_1c0;
  HandleSepImg.ResNum = (Uint32 *)DumpResource.ss;
  HandleSepImg.ss = (stringstream *)msg.field_2._8_8_;
  HandleSepImg.DumpResource = (anon_class_16_2_2bfcf79f *)local_1c0;
  HandleInptAtt.ResNum = (Uint32 *)DumpResource.ss;
  HandleInptAtt.ss = (stringstream *)msg.field_2._8_8_;
  HandleInptAtt.DumpResource = (anon_class_16_2_2bfcf79f *)local_1c0;
  HandleAccelStruct.ResNum = (Uint32 *)DumpResource.ss;
  HandleAccelStruct.ss = (stringstream *)msg.field_2._8_8_;
  HandleAccelStruct.DumpResource = (anon_class_16_2_2bfcf79f *)local_1c0;
  local_1c0 = (undefined1  [8])msg.field_2._8_8_;
  ProcessResources<Diligent::SPIRVShaderResources::DumpResources[abi:cxx11]()const::__0,Diligent::SPIRVShaderResources::DumpResources[abi:cxx11]()const::__1,Diligent::SPIRVShaderResources::DumpResources[abi:cxx11]()const::__2,Diligent::SPIRVShaderResources::DumpResources[abi:cxx11]()const::__3,Diligent::SPIRVShaderResources::DumpResources[abi:cxx11]()const::__4,Diligent::SPIRVShaderResources::DumpResources[abi:cxx11]()const::__5,Diligent::SPIRVShaderResources::DumpResources[abi:cxx11]()const::__6,Diligent::SPIRVShaderResources::DumpResources[abi:cxx11]()const::__7,Diligent::SPIRVShaderResources::DumpResources[abi:cxx11]()const::__8>
            (this,HandleUB,HandleSB,HandleImg,HandleSmplImg,HandleAC,HandleSepSmpl,HandleSepImg,
             HandleInptAtt,HandleAccelStruct);
  UVar1 = (Uint32)DumpResource.ResNum;
  UVar2 = GetTotalResources(this);
  if (UVar1 != UVar2) {
    FormatString<char[26],char[30]>
              ((string *)local_2b8,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"ResNum == GetTotalResources()",(char (*) [30])(ulong)UVar2);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"DumpResources",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
               ,0x3bf);
    std::__cxx11::string::~string((string *)local_2b8);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string SPIRVShaderResources::DumpResources() const
{
    std::stringstream ss;
    ss << "Shader '" << m_ShaderName << "' resource stats: total resources: " << GetTotalResources() << ":" << std::endl
       << "UBs: " << GetNumUBs() << "; SBs: " << GetNumSBs() << "; Imgs: " << GetNumImgs() << "; Smpl Imgs: " << GetNumSmpldImgs()
       << "; ACs: " << GetNumACs() << "; Sep Imgs: " << GetNumSepImgs() << "; Sep Smpls: " << GetNumSepSmplrs() << '.' << std::endl
       << "Resources:";

    Uint32 ResNum       = 0;
    auto   DumpResource = [&ss, &ResNum](const SPIRVShaderResourceAttribs& Res) {
        std::stringstream FullResNameSS;
        FullResNameSS << '\'' << Res.Name;
        if (Res.ArraySize > 1)
            FullResNameSS << '[' << Res.ArraySize << ']';
        FullResNameSS << '\'';
        ss << std::setw(32) << FullResNameSS.str();
        ++ResNum;
    };

    ProcessResources(
        [&](const SPIRVShaderResourceAttribs& UB, Uint32) //
        {
            VERIFY(UB.Type == SPIRVShaderResourceAttribs::ResourceType::UniformBuffer, "Unexpected resource type");
            ss << std::endl
               << std::setw(3) << ResNum << " Uniform Buffer     ";
            DumpResource(UB);
        },
        [&](const SPIRVShaderResourceAttribs& SB, Uint32) //
        {
            VERIFY(SB.Type == SPIRVShaderResourceAttribs::ResourceType::ROStorageBuffer ||
                       SB.Type == SPIRVShaderResourceAttribs::ResourceType::RWStorageBuffer,
                   "Unexpected resource type");
            ss << std::endl
               << std::setw(3) << ResNum
               << (SB.Type == SPIRVShaderResourceAttribs::ResourceType::ROStorageBuffer ? " RO Storage Buffer  " : " RW Storage Buffer  ");
            DumpResource(SB);
        },
        [&](const SPIRVShaderResourceAttribs& Img, Uint32) //
        {
            if (Img.Type == SPIRVShaderResourceAttribs::ResourceType::StorageImage)
            {
                ss << std::endl
                   << std::setw(3) << ResNum << " Storage Image    ";
            }
            else if (Img.Type == SPIRVShaderResourceAttribs::ResourceType::StorageTexelBuffer)
            {
                ss << std::endl
                   << std::setw(3) << ResNum << " Storage Txl Buff ";
            }
            else
                UNEXPECTED("Unexpected resource type");
            DumpResource(Img);
        },
        [&](const SPIRVShaderResourceAttribs& SmplImg, Uint32) //
        {
            if (SmplImg.Type == SPIRVShaderResourceAttribs::ResourceType::SampledImage)
            {
                ss << std::endl
                   << std::setw(3) << ResNum << " Sampled Image    ";
            }
            else if (SmplImg.Type == SPIRVShaderResourceAttribs::ResourceType::UniformTexelBuffer)
            {
                ss << std::endl
                   << std::setw(3) << ResNum << " Uniform Txl Buff ";
            }
            else
                UNEXPECTED("Unexpected resource type");
            DumpResource(SmplImg);
        },
        [&](const SPIRVShaderResourceAttribs& AC, Uint32) //
        {
            VERIFY(AC.Type == SPIRVShaderResourceAttribs::ResourceType::AtomicCounter, "Unexpected resource type");
            ss << std::endl
               << std::setw(3) << ResNum << " Atomic Cntr      ";
            DumpResource(AC);
        },
        [&](const SPIRVShaderResourceAttribs& SepSmpl, Uint32) //
        {
            VERIFY(SepSmpl.Type == SPIRVShaderResourceAttribs::ResourceType::SeparateSampler, "Unexpected resource type");
            ss << std::endl
               << std::setw(3) << ResNum << " Separate Smpl    ";
            DumpResource(SepSmpl);
        },
        [&](const SPIRVShaderResourceAttribs& SepImg, Uint32) //
        {
            VERIFY(SepImg.Type == SPIRVShaderResourceAttribs::ResourceType::SeparateImage, "Unexpected resource type");
            ss << std::endl
               << std::setw(3) << ResNum << " Separate Img     ";
            DumpResource(SepImg);
        },
        [&](const SPIRVShaderResourceAttribs& InptAtt, Uint32) //
        {
            VERIFY(InptAtt.Type == SPIRVShaderResourceAttribs::ResourceType::InputAttachment, "Unexpected resource type");
            ss << std::endl
               << std::setw(3) << ResNum << " Input Attachment ";
            DumpResource(InptAtt);
        },
        [&](const SPIRVShaderResourceAttribs& AccelStruct, Uint32) //
        {
            VERIFY(AccelStruct.Type == SPIRVShaderResourceAttribs::ResourceType::AccelerationStructure, "Unexpected resource type");
            ss << std::endl
               << std::setw(3) << ResNum << " Accel Struct     ";
            DumpResource(AccelStruct);
        } //
    );
    VERIFY_EXPR(ResNum == GetTotalResources());

    return ss.str();
}